

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::FederateInfo(FederateInfo *this,CoreType cType)

{
  undefined4 in_ESI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *__a;
  string *args;
  FederateInfo *this_02;
  CoreFederateInfo *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_31 [37];
  undefined4 local_c;
  
  local_c = in_ESI;
  CoreFederateInfo::CoreFederateInfo(in_stack_ffffffffffffff60);
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x4c) = 0x2f;
  *(undefined1 *)(in_RDI + 0x4d) = 0;
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  *(undefined1 *)(in_RDI + 0x4f) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x59) = 0;
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x80);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff70);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xc0);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  __a = (allocator<char> *)(in_RDI + 0x140);
  std::__cxx11::string::string(this_01);
  args = (string *)(in_RDI + 0x160);
  std::__cxx11::string::string(this_01);
  this_02 = (FederateInfo *)(in_RDI + 0x180);
  std::__cxx11::string::string(this_01);
  *(undefined1 *)(in_RDI + 0x1a0) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)args,__a);
  loadInfoFromArgsIgnoreOutput(this_02,args);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(local_31);
  *(undefined4 *)(in_RDI + 0x50) = local_c;
  return;
}

Assistant:

FederateInfo::FederateInfo(CoreType cType)
{
    loadInfoFromArgsIgnoreOutput("");
    coreType = cType;
}